

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

int waitForValue<int>(QPromise<int> *promise,int *initial)

{
  QSharedData *pQVar1;
  PromiseData<int> *pPVar2;
  bool bVar3;
  PromiseData<void> *this;
  QPromiseReject<void> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_c8;
  PromiseResolver<void> resolver;
  int value;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_b0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a0;
  QPromiseBase<void> local_98;
  _Any_data local_88;
  int *local_78;
  QPromiseBase<void> local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  QPromiseBase<void> local_30;
  
  value = *initial;
  local_98._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014d680;
  this = (PromiseData<void> *)operator_new(0x58);
  (this->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this);
  LOCK();
  pQVar1 = &(this->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014d638;
  local_98.m_d.d = this;
  local_68.m_d.d = this;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_68);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_68);
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_a0.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_a8.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_a8 = resolver.m_d.d;
  }
  local_b0.d = (Data *)0x0;
  pPVar2 = (promise->super_QPromiseBase<int>).m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_a8.d != (Data *)0x0) {
    LOCK();
    ((local_a8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_a8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78 = &value;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_c8 = resolver.m_d.d;
  local_88._M_unused._0_8_ = resolver.m_d.d;
  local_88._8_8_ = local_a8.d;
  local_58._M_unused._M_object = operator_new(0x18);
  *(void **)local_58._M_unused._0_8_ = local_88._M_unused._M_object;
  if ((Data *)local_88._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_88._M_unused._0_8_ = *local_88._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_88._8_8_;
  if ((Data *)local_88._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + 1;
    UNLOCK();
  }
  *(int **)((long)local_58._M_unused._0_8_ + 0x10) = local_78;
  pcStack_40 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<int,waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::{lambda(int_const&)#1}(int_const&)#1},int_const&>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::{lambda(int_const&)#1}(int_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_88._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&pPVar2->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  pPVar2 = (promise->super_QPromiseBase<int>).m_d.d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_88,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_c8,
             (QPromiseResolve<void> *)&local_a8,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&pPVar2->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_b0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_98._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014d638;
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&((promise->super_QPromiseBase<int>).m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&((promise->super_QPromiseBase<int>).m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  QtPromise::QPromiseBase<void>::wait(&local_30,&local_98);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_30);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_98);
  return value;
}

Assistant:

static inline T waitForValue(const QtPromise::QPromise<T>& promise, const T& initial)
{
    T value(initial);
    promise
        .then([&](const T& res) {
            value = res;
        })
        .wait();
    return value;
}